

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

void __thiscall
nnad::Matrix<double>::Matrix(Matrix<double> *this,int *Lines,int *Columns,int *RandomSeed)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  allocator_type local_11;
  
  iVar2 = *Lines;
  this->_Lines = iVar2;
  iVar1 = *Columns;
  this->_Columns = iVar1;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->_Matrix,(long)(iVar1 * iVar2),&local_11);
  srand(*RandomSeed);
  if (0 < this->_Columns * this->_Lines) {
    lVar3 = 0;
    do {
      iVar2 = rand();
      while( true ) {
        dVar4 = (double)(iVar2 % 100) * 0.02 + -1.0;
        if ((dVar4 != 0.0) || (NAN(dVar4))) break;
        iVar2 = rand();
      }
      (this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3] = dVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (long)this->_Columns * (long)this->_Lines);
  }
  return;
}

Assistant:

Matrix(int const& Lines, int const& Columns, int const& RandomSeed = -1):
      _Lines(Lines),
      _Columns(Columns),
      _Matrix(_Lines * _Columns)
    {
      // Initialise random number generator.
      srand(RandomSeed);

      // Fill in the matrix with random numbers distributed in [-1:1]
      for (int i = 0; i < _Lines * _Columns; i++)
        {
          double temp = 2e-2 * ( rand() % 100 ) - 1;
          while(!temp)
            temp = 2e-2 * ( rand() % 100 ) - 1;

          _Matrix[i] = T(temp);
        }
    }